

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int get32_packet(vorb *f)

{
  int iVar1;
  int iVar2;
  uint32 x;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = get8_packet((vorb *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = get8_packet((vorb *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  iVar1 = iVar2 * 0x100 + iVar1;
  iVar2 = get8_packet((vorb *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  iVar1 = iVar2 * 0x10000 + iVar1;
  iVar2 = get8_packet((vorb *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return iVar2 * 0x1000000 + iVar1;
}

Assistant:

static int get32_packet(vorb *f)
{
   uint32 x;
   x = get8_packet(f);
   x += get8_packet(f) << 8;
   x += get8_packet(f) << 16;
   x += (uint32) get8_packet(f) << 24;
   return x;
}